

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

bool RunCommand(char *comment,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *command,bool verbose,int *retCodeOut)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  undefined7 in_register_00000011;
  int retCode;
  string output;
  int local_54;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,comment);
    std::operator<<(poVar2,":\n");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_50,command," ");
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_54 = 0;
  bVar1 = cmSystemTools::RunSingleCommand
                    (command,&local_50,&local_50,&local_54,(char *)0x0,OUTPUT_NONE,0.0);
  lVar3 = std::__cxx11::string::find((char *)&local_50,0x477ce0);
  if ((lVar3 == -1) || (!bVar1 || local_54 != 0)) {
    std::operator<<((ostream *)&std::cout,(string *)&local_50);
  }
  if (bVar1) {
    if (retCodeOut == (int *)0x0) {
      if (local_54 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,comment);
        poVar2 = std::operator<<(poVar2," failed. with ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_54);
        std::operator<<(poVar2,"\n");
        bVar1 = local_54 == 0;
        goto LAB_00269be3;
      }
    }
    else {
      *retCodeOut = local_54;
    }
    bVar1 = true;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,comment);
    poVar2 = std::operator<<(poVar2," failed to run.");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
  }
LAB_00269be3:
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

static bool RunCommand(const char* comment,
                       std::vector<std::string>& command,
                       bool verbose,
                       int* retCodeOut = 0)
{
  if(verbose)
    {
    std::cout << comment << ":\n";
    std::cout << cmJoin(command, " ") << "\n";
    }
  std::string output;
  int retCode =0;
  // use rc command to create .res file
  bool res = cmSystemTools::RunSingleCommand(command,
                                             &output, &output,
                                             &retCode, 0,
                                             cmSystemTools::OUTPUT_NONE);
  // always print the output of the command, unless
  // it is the dumb rc command banner, but if the command
  // returned an error code then print the output anyway as
  // the banner may be mixed with some other important information.
  if(output.find("Resource Compiler Version") == output.npos
     || !res || retCode)
    {
    std::cout << output;
    }
  if (!res)
    {
    std::cout << comment << " failed to run." << std::endl;
    return false;
    }
  // if retCodeOut is requested then always return true
  // and set the retCodeOut to retCode
  if(retCodeOut)
    {
    *retCodeOut = retCode;
    return true;
    }
  if(retCode != 0)
    {
    std::cout << comment << " failed. with " << retCode << "\n";
    }
  return retCode == 0;
}